

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O0

double __thiscall dlib::rand::get_random_gaussian(rand *this)

{
  long in_RDI;
  double dVar1;
  complex<double> r;
  complex<double> local_20;
  double local_8;
  
  if ((*(byte *)(in_RDI + 0x13b8) & 1) == 0) {
    get_random_complex_gaussian((rand *)r._M_value._8_8_);
    dVar1 = std::complex<double>::imag_abi_cxx11_(&local_20);
    *(double *)(in_RDI + 0x13c0) = dVar1;
    *(undefined1 *)(in_RDI + 0x13b8) = 1;
    local_8 = std::complex<double>::real_abi_cxx11_(&local_20);
  }
  else {
    *(undefined1 *)(in_RDI + 0x13b8) = 0;
    local_8 = *(double *)(in_RDI + 0x13c0);
  }
  return local_8;
}

Assistant:

double get_random_gaussian (
            )
            {
                if (has_gaussian)
                {
                    has_gaussian = false;
                    return next_gaussian;
                }
                
                std::complex<double> r = get_random_complex_gaussian();
                next_gaussian = r.imag();
                has_gaussian = true;
                return r.real();
            }